

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp_asn1.cc
# Opt level: O0

EVP_PKEY_ASN1_METHOD * parse_key_type(CBS *cbs)

{
  EVP_PKEY_ASN1_METHOD *pEVar1;
  int iVar2;
  size_t sVar3;
  uint8_t *s1;
  EVP_PKEY_ASN1_METHOD *method;
  undefined1 local_28 [4];
  uint i;
  CBS oid;
  CBS *cbs_local;
  
  oid.len = (size_t)cbs;
  iVar2 = CBS_get_asn1(cbs,(CBS *)local_28,6);
  if (iVar2 != 0) {
    for (method._4_4_ = 0; method._4_4_ < 5; method._4_4_ = method._4_4_ + 1) {
      pEVar1 = kASN1Methods[method._4_4_];
      sVar3 = CBS_len((CBS *)local_28);
      if (sVar3 == pEVar1->oid_len) {
        s1 = CBS_data((CBS *)local_28);
        iVar2 = OPENSSL_memcmp(s1,pEVar1->oid,(ulong)pEVar1->oid_len);
        if (iVar2 == 0) {
          return pEVar1;
        }
      }
    }
  }
  return (EVP_PKEY_ASN1_METHOD *)0x0;
}

Assistant:

static const EVP_PKEY_ASN1_METHOD *parse_key_type(CBS *cbs) {
  CBS oid;
  if (!CBS_get_asn1(cbs, &oid, CBS_ASN1_OBJECT)) {
    return NULL;
  }

  for (unsigned i = 0; i < OPENSSL_ARRAY_SIZE(kASN1Methods); i++) {
    const EVP_PKEY_ASN1_METHOD *method = kASN1Methods[i];
    if (CBS_len(&oid) == method->oid_len &&
        OPENSSL_memcmp(CBS_data(&oid), method->oid, method->oid_len) == 0) {
      return method;
    }
  }

  return NULL;
}